

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader-network.cc
# Opt level: O2

bool tinyusdz::tydra::EvaluateShaderAttribute<tinyusdz::value::vector3d>
               (Stage *stage,Shader *shader,string *attr_name,vector3d *out_val,string *err,
               TimeCode timeCode)

{
  double dVar1;
  UsdPreviewSurface *pUVar2;
  vector3d *pvVar3;
  Value outval;
  storage_union local_98;
  undefined **local_88;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (out_val != (vector3d *)0x0) {
    local_88 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_98.dynamic = (void *)0x0;
    pUVar2 = tinyusdz::value::Value::as<tinyusdz::UsdPreviewSurface>(&shader->value,false);
    if (pUVar2 == (UsdPreviewSurface *)0x0) {
      if (err != (string *)0x0) {
        linb::any::type_name_abi_cxx11_(&local_80,&(shader->value).v_);
        ::std::operator+(&local_60,"Unsupported shader type: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_80);
        ::std::operator+(&local_40,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_60,"\n");
        ::std::__cxx11::string::append((string *)err);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
    }
    else {
      ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        attr_name,"diffuseColor");
      pvVar3 = tinyusdz::value::Value::as<tinyusdz::value::vector3d>((Value *)&local_98,false);
      if (pvVar3 == (vector3d *)0x0) {
        if (err != (string *)0x0) {
          ::std::__cxx11::string::append((char *)err);
        }
      }
      else {
        out_val->z = pvVar3->z;
        dVar1 = pvVar3->y;
        out_val->x = pvVar3->x;
        out_val->y = dVar1;
      }
    }
    if (local_88 != (undefined **)0x0) {
      (*(code *)local_88[4])(&local_98);
    }
  }
  return false;
}

Assistant:

bool EvaluateShaderAttribute(
  const Stage &stage,
  const Shader &shader, const std::string &attr_name,
  T * out_val,
  std::string *err,
  const value::TimeCode timeCode) {

  if (!out_val) {
    return false;
  }

  uint32_t tyid = value::TypeTraits<T>::type_id();
  value::Value outval;

  bool result = false;

  if (const auto *psurf = shader.value.as<UsdPreviewSurface>()) {
    result = EvaluateUsdPreviewSurfaceAttribute(stage, *psurf, attr_name, tyid, outval, err, timeCode);
    if (const auto pt = outval.as<T>()) {
      (*out_val) = (*pt);
    } else {
      if (err) {
        (*err) += "[InternalError] Type mismatch.\n";
      }
      return false;
    }
  } else {
    if (err) {
      (*err) += "Unsupported shader type: " + shader.value.type_name() + "\n";
    }
    return false;
  }

  return result;
}